

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> *this_00;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_> *pMVar1;
  int iVar2;
  Maybe<kj::Own<capnp::_::SegmentReader>_&> MVar3;
  undefined4 extraout_var;
  SegmentReader *pSVar4;
  ulong extraout_RDX;
  anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_2
  *this_01;
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> lock;
  SegmentId local_5c;
  Own<capnp::_::SegmentReader> local_58;
  Mutex *local_48;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_> *local_40;
  anon_class_8_1_89918cff local_38;
  
  if (id.value == 0) {
    if ((this->segment0).ptr.size_ != 0) {
      return &this->segment0;
    }
    return (SegmentReader *)0x0;
  }
  this_00 = &this->moreSegments;
  this_01 = (anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_2
             *)0x0;
  local_5c.value = id.value;
  kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  pMVar1 = &(this->moreSegments).value;
  local_48 = &this_00->mutex;
  local_40 = pMVar1;
  if ((this->moreSegments).value.ptr.isSet == true) {
    this_01 = &(this->moreSegments).value.ptr.field_1;
    MVar3 = kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::find<unsigned_int&>
                      ((HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *)&this_01->value,
                       &local_5c.value);
    if (MVar3.ptr != (Own<capnp::_::SegmentReader> *)0x0) {
      pSVar4 = (MVar3.ptr)->ptr;
      goto LAB_00273ab4;
    }
  }
  iVar2 = (*this->message->_vptr_MessageReader[2])();
  if (extraout_RDX == 0) {
    pSVar4 = (SegmentReader *)0x0;
  }
  else {
    if (0x1fffffff < extraout_RDX) {
      anon_func::anon_class_8_1_89918cff::operator()(&local_38);
    }
    if ((pMVar1->ptr).isSet == false) {
      this_01 = &(this->moreSegments).value.ptr.field_1;
      (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.ptr = (HashBucket *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.size_ = 0;
      *(undefined8 *)&(this->moreSegments).value.ptr.field_1.value.table.indexes = 0;
      (this->moreSegments).value.ptr.field_1.value.table.indexes.erasedCount = 0;
      (this->moreSegments).value.ptr.field_1.value.table.rows.builder.endPtr = (Entry *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.rows.builder.disposer =
           (ArrayDisposer *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.rows.builder.ptr = (Entry *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.rows.builder.pos =
           (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.disposer =
           (ArrayDisposer *)0x0;
      (this->moreSegments).value.ptr.isSet = true;
    }
    pSVar4 = (SegmentReader *)operator_new(0x28);
    pSVar4->arena = &this->super_Arena;
    (pSVar4->id).value = local_5c.value;
    (pSVar4->ptr).ptr = (word *)CONCAT44(extraout_var,iVar2);
    (pSVar4->ptr).size_ = extraout_RDX;
    pSVar4->readLimiter = &this->readLimiter;
    local_58.disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentReader>::instance;
    local_58.ptr = pSVar4;
    kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::insert
              (&this_01->value,local_5c.value,&local_58);
    if (local_58.ptr != (SegmentReader *)0x0) {
      local_58.ptr = (SegmentReader *)0x0;
      (**(local_58.disposer)->_vptr_Disposer)();
    }
  }
LAB_00273ab4:
  if (local_48 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_48,EXCLUSIVE);
  }
  return pSVar4;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_MAYBE(s, *lock) {
    KJ_IF_MAYBE(segment, s->find(id.value)) {
      return *segment;
    }
    segments = s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegmentSize(newSegment.size());

  if (*lock == nullptr) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}